

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexer.cc
# Opt level: O3

void __thiscall flow::lang::Lexer::processCommand(Lexer *this,string *line)

{
  Report *this_00;
  int iVar1;
  long lVar2;
  long lVar3;
  string pattern;
  string local_38;
  
  iVar1 = strncmp((line->_M_dataplus)._M_p,"include",7);
  if (iVar1 == 0) {
    lVar2 = std::__cxx11::string::find((char)line,0x22);
    lVar3 = std::__cxx11::string::rfind((char)line,0x22);
    if (lVar2 == -1 || lVar3 == -1) {
      this_00 = this->report_;
      local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_38,"Malformed #include line","");
      diagnostics::Report::tokenError<>(this_00,&this->lastLocation_,&local_38);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_38._M_dataplus._M_p == &local_38.field_2) {
        return;
      }
    }
    else {
      std::__cxx11::string::substr((ulong)&local_38,(ulong)line);
      enterScope(this,&local_38);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_38._M_dataplus._M_p == &local_38.field_2) {
        return;
      }
    }
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void Lexer::processCommand(const std::string& line) {
  // `#include "glob"`

  if (strncmp(line.c_str(), "include", 7) != 0) return;

  // TODO this is *very* basic sub-tokenization, but it does well until properly
  // implemented.

  size_t beg = line.find('"');
  size_t end = line.rfind('"');
  if (beg == std::string::npos || end == std::string::npos) {
    report_.tokenError(lastLocation(), "Malformed #include line");
    return;
  }

  std::string pattern = line.substr(beg + 1, end - beg - 1);

#if defined(HAVE_GLOB_H)
  glob_t gl;

  int globOptions = 0;
#if defined(GLOB_TILDE)
  globOptions |= GLOB_TILDE;
#endif

  int rv = glob(pattern.c_str(), globOptions, nullptr, &gl);
  if (rv != 0) {
    static std::unordered_map<int, const char*> globErrs = {
        {GLOB_NOSPACE, "No space"},
        {GLOB_ABORTED, "Aborted"},
        {GLOB_NOMATCH, "No Match"}, };
    report_.tokenError(lastLocation(), "glob() error: {}", globErrs[rv]);
    return;
  }

  // put globbed files on stack in reverse order, to be lexed in the right order
  for (size_t i = 0; i < gl.gl_pathc; ++i) {
    const char* filename = gl.gl_pathv[gl.gl_pathc - i - 1];
    enterScope(filename);
  }

  globfree(&gl);
#else
  enterScope(pattern);
#endif
}